

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O3

bool __thiscall lzham::search_accelerator::find_all_matches(search_accelerator *this,uint num_bytes)

{
  byte *pbVar1;
  byte bVar2;
  uchar *puVar3;
  char cVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  void *pData_ptr;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint64 data;
  uint uVar11;
  vector<unsigned_int> *pvVar12;
  
  uVar9 = this->m_max_probes * num_bytes;
  if (((this->m_matches).m_capacity < uVar9) &&
     (cVar4 = lzham::elemental_vector::increase_capacity
                        ((int)this + 0x78,SUB41(uVar9,0),
                         (uint)((this->m_matches).m_size + 1 == uVar9),
                         (_func_void_void_ptr_void_ptr_uint *)0x6,false), cVar4 == '\0')) {
    return false;
  }
  (this->m_matches).m_size = uVar9;
  if (((this->m_match_refs).m_capacity < num_bytes) &&
     (cVar4 = lzham::elemental_vector::increase_capacity
                        ((int)this + 0x90,SUB41(num_bytes,0),
                         (uint)((this->m_match_refs).m_size + 1 == num_bytes),
                         (_func_void_void_ptr_void_ptr_uint *)0x8,false), cVar4 == '\0')) {
    return false;
  }
  (this->m_match_refs).m_size = num_bytes;
  data = 0xff;
  memset((this->m_match_refs).m_p,0xff,(ulong)(num_bytes * 8));
  this->m_fill_lookahead_pos = this->m_lookahead_pos;
  this->m_fill_lookahead_size = num_bytes;
  this->m_fill_dict_size = this->m_cur_dict_size;
  this->m_next_match_ref = 0;
  if (((this->m_pTask_pool == (task_pool *)0x0) || (num_bytes < 0x400)) ||
     (this->m_max_helper_threads == 0)) {
    find_all_matches_callback_st(this,data,pData_ptr);
    this->m_num_completed_helper_threads = 0;
  }
  else {
    uVar9 = num_bytes - 2;
    uVar7 = uVar9;
    do {
      uVar10 = this->m_fill_lookahead_pos + uVar7;
      uVar11 = this->m_max_dict_size_mask & uVar10;
      (this->m_nodes).m_p[uVar11].m_left = 0;
      (this->m_nodes).m_p[uVar11].m_right = 0;
      (this->m_match_refs).m_p[uVar10 - this->m_fill_lookahead_pos] = -2;
      uVar7 = uVar7 + 1;
    } while (uVar7 < num_bytes);
    uVar7 = this->m_max_helper_threads;
    if ((ulong)uVar7 != 0) {
      lVar8 = 0;
      do {
        if (*(int *)((long)&this->m_thread_dict_offsets[0].m_size + lVar8) != 0) {
          *(undefined4 *)((long)&this->m_thread_dict_offsets[0].m_size + lVar8) = 0;
        }
        lVar8 = lVar8 + 0x18;
      } while ((ulong)uVar7 * 0x18 != lVar8);
    }
    puVar3 = (this->m_dict).m_p;
    uVar6 = (ulong)(this->m_max_dict_size_mask & this->m_lookahead_pos);
    if (this->m_hash24 == false) {
      pbVar1 = puVar3 + uVar6;
      lVar8 = 0;
      uVar7 = (uint)*pbVar1;
      uVar10 = (uint)pbVar1[1];
      do {
        bVar2 = pbVar1[lVar8 + 2];
        uVar7 = ((uint)bVar2 << 4 ^ (uVar10 << 8 | uVar7)) * -0x3f;
        uVar7 = uVar7 >> 0x11 ^ uVar7;
        uVar7 = uVar7 * -0x1ff ^ uVar7 * -0x1ff0;
        uVar7 = uVar7 * -7 ^ uVar7 * -0x1c00;
        pvVar12 = this->m_thread_dict_offsets +
                  (ulong)(uVar7 >> 0xf ^ uVar7) % (ulong)this->m_max_helper_threads;
        uVar7 = pvVar12->m_size;
        if (pvVar12->m_capacity <= uVar7) {
          cVar4 = lzham::elemental_vector::increase_capacity
                            ((uint)pvVar12,(bool)((char)uVar7 + '\x01'),1,
                             (_func_void_void_ptr_void_ptr_uint *)0x4,false);
          if (cVar4 == '\0') {
            return false;
          }
          uVar7 = pvVar12->m_size;
        }
        pvVar12->m_p[uVar7] = (uint)lVar8;
        pvVar12->m_size = pvVar12->m_size + 1;
        lVar8 = lVar8 + 1;
        uVar7 = uVar10;
        uVar10 = (uint)bVar2;
      } while (uVar9 != (uint)lVar8);
    }
    else {
      uVar10 = (uint)puVar3[uVar6 + 1] << 0x10 | (uint)puVar3[uVar6] << 8;
      if (uVar7 - 1 < (uVar7 ^ uVar7 - 1)) {
        lVar8 = 0;
        do {
          uVar10 = (uint)puVar3[lVar8 + uVar6 + 2] << 0x10 | uVar10 >> 8;
          uVar11 = uVar10 * -0x3f >> 0x11 ^ uVar10 * -0x3f;
          uVar11 = uVar11 * -0x1ff ^ uVar11 * -0x1ff0;
          uVar11 = uVar11 * -7 ^ uVar11 * -0x1c00;
          pvVar12 = this->m_thread_dict_offsets + ((uVar11 >> 0xf ^ uVar11) & uVar7 - 1);
          uVar11 = pvVar12->m_size;
          if (pvVar12->m_capacity <= uVar11) {
            cVar4 = lzham::elemental_vector::increase_capacity
                              ((uint)pvVar12,(bool)((char)uVar11 + '\x01'),1,
                               (_func_void_void_ptr_void_ptr_uint *)0x4,false);
            if (cVar4 == '\0') {
              return false;
            }
            uVar11 = pvVar12->m_size;
          }
          pvVar12->m_p[uVar11] = (uint)lVar8;
          pvVar12->m_size = pvVar12->m_size + 1;
          lVar8 = lVar8 + 1;
        } while (uVar9 != (uint)lVar8);
      }
      else {
        lVar8 = 0;
        do {
          uVar10 = (uint)puVar3[lVar8 + uVar6 + 2] << 0x10 | uVar10 >> 8;
          uVar7 = uVar10 * -0x3f >> 0x11 ^ uVar10 * -0x3f;
          uVar7 = uVar7 * -0x1ff ^ uVar7 * -0x1ff0;
          uVar7 = uVar7 * -7 ^ uVar7 * -0x1c00;
          pvVar12 = this->m_thread_dict_offsets +
                    (ulong)(uVar7 >> 0xf ^ uVar7) % (ulong)this->m_max_helper_threads;
          uVar7 = pvVar12->m_size;
          if (pvVar12->m_capacity <= uVar7) {
            cVar4 = lzham::elemental_vector::increase_capacity
                              ((uint)pvVar12,(bool)((char)uVar7 + '\x01'),1,
                               (_func_void_void_ptr_void_ptr_uint *)0x4,false);
            if (cVar4 == '\0') {
              return false;
            }
            uVar7 = pvVar12->m_size;
          }
          pvVar12->m_p[uVar7] = (uint)lVar8;
          pvVar12->m_size = pvVar12->m_size + 1;
          lVar8 = lVar8 + 1;
        } while (uVar9 != (uint)lVar8);
      }
    }
    this->m_num_completed_helper_threads = 0;
    bVar5 = task_pool::
            queue_multiple_object_tasks<lzham::search_accelerator,void(lzham::search_accelerator::*)(unsigned_long_long,void*)>
                      (this->m_pTask_pool,this,
                       (offset_in_search_accelerator_to_subr)find_all_matches_callback_mt,0,0,
                       (void *)(ulong)this->m_max_helper_threads);
    if (!bVar5) {
      return false;
    }
  }
  if (this->m_len2_matches != true) {
    return true;
  }
  bVar5 = find_len2_matches(this);
  return bVar5;
}

Assistant:

bool search_accelerator::find_all_matches(uint num_bytes)
   {
      if (!m_matches.try_resize_no_construct(m_max_probes * num_bytes))
      {
         LZHAM_LOG_ERROR(9006);
         return false;
      }

      if (!m_match_refs.try_resize_no_construct(num_bytes))
      {
         LZHAM_LOG_ERROR(9007);
         return false;
      }

      memset(m_match_refs.get_ptr(), 0xFF, m_match_refs.size_in_bytes());

      m_fill_lookahead_pos = m_lookahead_pos;
      m_fill_lookahead_size = num_bytes;
      m_fill_dict_size = m_cur_dict_size;

      m_next_match_ref = 0;

      if ((!m_pTask_pool) || (m_max_helper_threads < 1) || (num_bytes < 1024))
      {
         find_all_matches_callback_st(0, NULL);
         
         m_num_completed_helper_threads = 0;
      }
      else
      {
         for (uint i = num_bytes - 2; i < num_bytes; i++)
         {
            uint fill_lookahead_pos = m_fill_lookahead_pos + i;
            uint insert_pos = fill_lookahead_pos & m_max_dict_size_mask;
            m_nodes[insert_pos].m_left = 0;
            m_nodes[insert_pos].m_right = 0;

            m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)] = -2;
         }

         for (uint i = 0; i < m_max_helper_threads; i++)
            m_thread_dict_offsets[i].try_resize(0);

         uint bytes_to_add = num_bytes - 2;

         scoped_perf_section sect(cVarArgs, "****** find_all_matches_prep %u", bytes_to_add);
                       
         const uint8* pDict = &m_dict[m_lookahead_pos & m_max_dict_size_mask];
                     
         if (m_hash24)
         {
            uint t = (pDict[0] << 8) | (pDict[1] << 16);

            if (math::is_power_of_2(m_max_helper_threads))
            {
               const uint bitmask = (m_max_helper_threads - 1);
               for (uint i = 0; i < bytes_to_add; i++)
               {
                  t = (t >> 8) | (pDict[2] << 16);

                  LZHAM_ASSERT(t == LZHAM_HASH3_24(pDict[0], pDict[1], pDict[2]));

                  uint thread_index = bitmix32(t) & bitmask;

                  if (!m_thread_dict_offsets[thread_index].try_push_back(i))
                  {
                     LZHAM_LOG_ERROR(9008);
                     return false;
                  }

                  pDict++;
               }
            }
            else
            {
               for (uint i = 0; i < bytes_to_add; i++)
               {
                  t = (t >> 8) | (pDict[2] << 16);

                  LZHAM_ASSERT(t == LZHAM_HASH3_24(pDict[0], pDict[1], pDict[2]));

                  uint thread_index = bitmix32(t) % m_max_helper_threads;

                  if (!m_thread_dict_offsets[thread_index].try_push_back(i))
                  {
                     LZHAM_LOG_ERROR(9009);
                     return false;
                  }

                  pDict++;
               }
            }
         }
         else
         {
            uint c0 = pDict[0];
            uint c1 = pDict[1];
                  
            for (uint i = 0; i < bytes_to_add; i++)
            {
               uint c2 = pDict[2];
               
               uint t = LZHAM_HASH3_16(c0, c1, c2);

               c0 = c1;
               c1 = c2;
                                                            
               uint thread_index = bitmix32(t) % m_max_helper_threads;

               if (!m_thread_dict_offsets[thread_index].try_push_back(i))
               {
                  LZHAM_LOG_ERROR(9010);
                  return false;
               }
               
               pDict++;
            }
         }
         
         m_num_completed_helper_threads = 0;
         
         if (!m_pTask_pool->queue_multiple_object_tasks(this, &search_accelerator::find_all_matches_callback_mt, 0, m_max_helper_threads))
         {
            LZHAM_LOG_ERROR(9011);
            return false;
         }
      }

      return m_len2_matches ? find_len2_matches() : true;
   }